

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_decompressContinue
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  uint uVar1;
  U32 UVar2;
  U32 UVar3;
  ZSTD_DCtx *pZVar4;
  void *pvVar5;
  size_t sVar6;
  ZSTD_DCtx *pZVar7;
  XXH64_hash_t XVar8;
  ZSTD_dStage ZVar9;
  void *in_RCX;
  size_t in_RDX;
  void *in_RSI;
  ZSTD_DCtx *in_RDI;
  ZSTD_DCtx *in_R8;
  void *unaff_retaddr;
  size_t in_stack_00000008;
  void *in_stack_00000010;
  ZSTD_DCtx *in_stack_00000018;
  U32 check32;
  U32 h32;
  size_t err_code_2;
  size_t err_code_1;
  size_t rSize;
  size_t cBlockSize;
  blockProperties_t bp;
  size_t err_code;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  XXH_NAMESPACEXXH64_state_t *in_stack_ffffffffffffff70;
  void *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  void *in_stack_ffffffffffffff98;
  ZSTD_DCtx *local_58;
  undefined4 in_stack_ffffffffffffffb8;
  blockType_e in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  XXH_NAMESPACEXXH64_state_t *in_stack_ffffffffffffffc8;
  size_t in_stack_fffffffffffffff8;
  
  pZVar7 = in_R8;
  pZVar4 = (ZSTD_DCtx *)ZSTD_nextSrcSizeToDecompressWithInputSize(in_RDI,(size_t)in_R8);
  if (pZVar7 == pZVar4) {
    ZSTD_checkContinuity(in_RDI,in_RSI,in_RDX);
    in_RDI->processedCSize = (long)((in_R8->entropy).LLTable + -4) + in_RDI->processedCSize;
    pvVar5 = (void *)(ulong)in_RDI->stage;
    switch(pvVar5) {
    case (void *)0x0:
      if (in_RCX == (void *)0x0) {
        __assert_fail("src != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa039,
                      "size_t ZSTD_decompressContinue(ZSTD_DCtx *, void *, size_t, const void *, size_t)"
                     );
      }
      if (in_RDI->format == ZSTD_f_zstd1) {
        if (in_R8 < (ZSTD_DCtx *)0x4) {
          __assert_fail("srcSize >= ZSTD_FRAMEIDSIZE",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xa03b,
                        "size_t ZSTD_decompressContinue(ZSTD_DCtx *, void *, size_t, const void *, size_t)"
                       );
        }
        UVar3 = MEM_readLE32((void *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        if ((UVar3 & 0xfffffff0) == 0x184d2a50) {
          memcpy(in_RDI->headerBuffer,in_RCX,(size_t)in_R8);
          in_RDI->expected = 8 - (long)in_R8;
          in_RDI->stage = ZSTDds_decodeSkippableHeader;
          return 0;
        }
      }
      sVar6 = ZSTD_frameHeaderSize_internal
                        (in_stack_ffffffffffffff98,
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         (ZSTD_format_e)((ulong)pZVar7 >> 0x20));
      in_RDI->headerSize = sVar6;
      uVar1 = ZSTD_isError(0x2f4cb4);
      if (uVar1 == 0) {
        memcpy(in_RDI->headerBuffer,in_RCX,(size_t)in_R8);
        in_RDI->expected = in_RDI->headerSize - (long)in_R8;
        in_RDI->stage = ZSTDds_decodeFrameHeader;
        pZVar7 = (ZSTD_DCtx *)0x0;
      }
      else {
        pZVar7 = (ZSTD_DCtx *)in_RDI->headerSize;
      }
      break;
    case (void *)0x1:
      if (in_RCX == (void *)0x0) {
        __assert_fail("src != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa04a,
                      "size_t ZSTD_decompressContinue(ZSTD_DCtx *, void *, size_t, const void *, size_t)"
                     );
      }
      memcpy((void *)((long)in_RDI + (in_RDI->headerSize - (long)in_R8) + 0x176c4),in_RCX,
             (size_t)in_R8);
      pZVar7 = (ZSTD_DCtx *)ZSTD_decodeFrameHeader(pZVar7,pvVar5,(size_t)in_stack_ffffffffffffff78);
      uVar1 = ERR_isError((size_t)pZVar7);
      if (uVar1 == 0) {
        in_RDI->expected = 3;
        in_RDI->stage = ZSTDds_decodeBlockHeader;
        pZVar7 = (ZSTD_DCtx *)0x0;
      }
      break;
    case (void *)0x2:
      pZVar7 = (ZSTD_DCtx *)
               ZSTD_getcBlockSize(in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70,
                                  (blockProperties_t *)
                                  CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      uVar1 = ZSTD_isError(0x2f4e43);
      if (uVar1 == 0) {
        if ((ZSTD_DCtx *)(ulong)(in_RDI->fParams).blockSizeMax < pZVar7) {
          pZVar7 = (ZSTD_DCtx *)0xffffffffffffffec;
        }
        else {
          in_RDI->expected = (size_t)pZVar7;
          in_RDI->bType = in_stack_ffffffffffffffbc;
          in_RDI->rleSize = (ulong)in_stack_ffffffffffffffc4;
          if (pZVar7 == (ZSTD_DCtx *)0x0) {
            if (in_stack_ffffffffffffffc0 == 0) {
              in_RDI->expected = 3;
              in_RDI->stage = ZSTDds_decodeBlockHeader;
            }
            else if ((in_RDI->fParams).checksumFlag == 0) {
              in_RDI->expected = 0;
              in_RDI->stage = ZSTDds_getFrameHeaderSize;
            }
            else {
              in_RDI->expected = 4;
              in_RDI->stage = ZSTDds_checkChecksum;
            }
            pZVar7 = (ZSTD_DCtx *)0x0;
          }
          else {
            ZVar9 = ZSTDds_decompressBlock;
            if (in_stack_ffffffffffffffc0 != 0) {
              ZVar9 = ZSTDds_decompressLastBlock;
            }
            in_RDI->stage = ZVar9;
            pZVar7 = (ZSTD_DCtx *)0x0;
          }
        }
      }
      break;
    case (void *)0x3:
    case (void *)0x4:
      pvVar5 = (void *)(ulong)in_RDI->bType;
      switch(pvVar5) {
      case (void *)0x0:
        if ((ZSTD_DCtx *)in_RDI->expected < in_R8) {
          __assert_fail("srcSize <= dctx->expected",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xa079,
                        "size_t ZSTD_decompressContinue(ZSTD_DCtx *, void *, size_t, const void *, size_t)"
                       );
        }
        local_58 = (ZSTD_DCtx *)
                   ZSTD_copyRawBlock(pvVar5,(size_t)in_stack_ffffffffffffff70,
                                     (void *)CONCAT44(in_stack_ffffffffffffff6c,
                                                      in_stack_ffffffffffffff68),0x2f5068);
        uVar1 = ERR_isError((size_t)local_58);
        if (uVar1 != 0) {
          return (size_t)local_58;
        }
        if (local_58 != in_R8) {
          __assert_fail("rSize == srcSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xa07c,
                        "size_t ZSTD_decompressContinue(ZSTD_DCtx *, void *, size_t, const void *, size_t)"
                       );
        }
        in_RDI->expected = in_RDI->expected - (long)local_58;
        break;
      case (void *)0x1:
        local_58 = (ZSTD_DCtx *)
                   ZSTD_setRleBlock(pvVar5,(size_t)in_stack_ffffffffffffff70,
                                    (BYTE)((uint)in_stack_ffffffffffffff6c >> 0x18),0x2f5112);
        in_RDI->expected = 0;
        break;
      case (void *)0x2:
        local_58 = (ZSTD_DCtx *)
                   ZSTD_decompressBlock_internal
                             (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                              in_stack_fffffffffffffff8,(int)((ulong)in_RDI >> 0x20),
                              (streaming_operation)err_code_2);
        in_RDI->expected = 0;
        break;
      case (void *)0x3:
      default:
        return 0xffffffffffffffec;
      }
      pZVar7 = local_58;
      uVar1 = ERR_isError((size_t)local_58);
      if (uVar1 == 0) {
        if ((ZSTD_DCtx *)(ulong)(in_RDI->fParams).blockSizeMax < local_58) {
          pZVar7 = (ZSTD_DCtx *)0xffffffffffffffec;
        }
        else {
          in_RDI->decodedSize = (long)((local_58->entropy).LLTable + -4) + in_RDI->decodedSize;
          if (in_RDI->validateChecksum != 0) {
            XXH_INLINE_XXH64_update
                      (in_stack_ffffffffffffffc8,
                       (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
          }
          in_RDI->previousDstEnd = (void *)((long)in_RSI + (long)local_58);
          pZVar7 = local_58;
          if (in_RDI->expected == 0) {
            if (in_RDI->stage == ZSTDds_decompressLastBlock) {
              if (((in_RDI->fParams).frameContentSize == 0xffffffffffffffff) ||
                 (in_RDI->decodedSize == (in_RDI->fParams).frameContentSize)) {
                if ((in_RDI->fParams).checksumFlag == 0) {
                  ZSTD_DCtx_trace_end(in_RDI,in_RDI->decodedSize,in_RDI->processedCSize,1);
                  in_RDI->expected = 0;
                  in_RDI->stage = ZSTDds_getFrameHeaderSize;
                }
                else {
                  in_RDI->expected = 4;
                  in_RDI->stage = ZSTDds_checkChecksum;
                }
              }
              else {
                pZVar7 = (ZSTD_DCtx *)0xffffffffffffffec;
              }
            }
            else {
              in_RDI->stage = ZSTDds_decodeBlockHeader;
              in_RDI->expected = 3;
            }
          }
        }
      }
      break;
    case (void *)0x5:
      if (in_R8 != (ZSTD_DCtx *)0x4) {
        __assert_fail("srcSize == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa0a9,
                      "size_t ZSTD_decompressContinue(ZSTD_DCtx *, void *, size_t, const void *, size_t)"
                     );
      }
      if (in_RDI->validateChecksum != 0) {
        XVar8 = XXH_INLINE_XXH64_digest(in_stack_ffffffffffffff70);
        UVar3 = (U32)XVar8;
        UVar2 = MEM_readLE32((void *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        if (UVar2 != UVar3) {
          return 0xffffffffffffffea;
        }
      }
      ZSTD_DCtx_trace_end(in_RDI,in_RDI->decodedSize,in_RDI->processedCSize,1);
      in_RDI->expected = 0;
      in_RDI->stage = ZSTDds_getFrameHeaderSize;
      pZVar7 = (ZSTD_DCtx *)0x0;
      break;
    case (void *)0x6:
      if (in_RCX == (void *)0x0) {
        __assert_fail("src != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa0b8,
                      "size_t ZSTD_decompressContinue(ZSTD_DCtx *, void *, size_t, const void *, size_t)"
                     );
      }
      if ((ZSTD_DCtx *)0x8 < in_R8) {
        __assert_fail("srcSize <= ZSTD_SKIPPABLEHEADERSIZE",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa0b9,
                      "size_t ZSTD_decompressContinue(ZSTD_DCtx *, void *, size_t, const void *, size_t)"
                     );
      }
      memcpy((void *)((long)in_RDI + (0x176cc - (long)in_R8)),in_RCX,(size_t)in_R8);
      UVar3 = MEM_readLE32((void *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      in_RDI->expected = (ulong)UVar3;
      in_RDI->stage = ZSTDds_skipFrame;
      pZVar7 = (ZSTD_DCtx *)0x0;
      break;
    case (void *)0x7:
      in_RDI->expected = 0;
      in_RDI->stage = ZSTDds_getFrameHeaderSize;
      pZVar7 = (ZSTD_DCtx *)0x0;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa0c5,
                    "size_t ZSTD_decompressContinue(ZSTD_DCtx *, void *, size_t, const void *, size_t)"
                   );
    }
  }
  else {
    pZVar7 = (ZSTD_DCtx *)0xffffffffffffffb8;
  }
  return (size_t)pZVar7;
}

Assistant:

size_t ZSTD_decompressContinue(ZSTD_DCtx* dctx, void* dst, size_t dstCapacity, const void* src, size_t srcSize)
{
    DEBUGLOG(5, "ZSTD_decompressContinue (srcSize:%u)", (unsigned)srcSize);
    /* Sanity check */
    RETURN_ERROR_IF(srcSize != ZSTD_nextSrcSizeToDecompressWithInputSize(dctx, srcSize), srcSize_wrong, "not allowed");
    ZSTD_checkContinuity(dctx, dst, dstCapacity);

    dctx->processedCSize += srcSize;

    switch (dctx->stage)
    {
    case ZSTDds_getFrameHeaderSize :
        assert(src != NULL);
        if (dctx->format == ZSTD_f_zstd1) {  /* allows header */
            assert(srcSize >= ZSTD_FRAMEIDSIZE);  /* to read skippable magic number */
            if ((MEM_readLE32(src) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {        /* skippable frame */
                ZSTD_memcpy(dctx->headerBuffer, src, srcSize);
                dctx->expected = ZSTD_SKIPPABLEHEADERSIZE - srcSize;  /* remaining to load to get full skippable frame header */
                dctx->stage = ZSTDds_decodeSkippableHeader;
                return 0;
        }   }
        dctx->headerSize = ZSTD_frameHeaderSize_internal(src, srcSize, dctx->format);
        if (ZSTD_isError(dctx->headerSize)) return dctx->headerSize;
        ZSTD_memcpy(dctx->headerBuffer, src, srcSize);
        dctx->expected = dctx->headerSize - srcSize;
        dctx->stage = ZSTDds_decodeFrameHeader;
        return 0;

    case ZSTDds_decodeFrameHeader:
        assert(src != NULL);
        ZSTD_memcpy(dctx->headerBuffer + (dctx->headerSize - srcSize), src, srcSize);
        FORWARD_IF_ERROR(ZSTD_decodeFrameHeader(dctx, dctx->headerBuffer, dctx->headerSize), "");
        dctx->expected = ZSTD_blockHeaderSize;
        dctx->stage = ZSTDds_decodeBlockHeader;
        return 0;

    case ZSTDds_decodeBlockHeader:
        {   blockProperties_t bp;
            size_t const cBlockSize = ZSTD_getcBlockSize(src, ZSTD_blockHeaderSize, &bp);
            if (ZSTD_isError(cBlockSize)) return cBlockSize;
            RETURN_ERROR_IF(cBlockSize > dctx->fParams.blockSizeMax, corruption_detected, "Block Size Exceeds Maximum");
            dctx->expected = cBlockSize;
            dctx->bType = bp.blockType;
            dctx->rleSize = bp.origSize;
            if (cBlockSize) {
                dctx->stage = bp.lastBlock ? ZSTDds_decompressLastBlock : ZSTDds_decompressBlock;
                return 0;
            }
            /* empty block */
            if (bp.lastBlock) {
                if (dctx->fParams.checksumFlag) {
                    dctx->expected = 4;
                    dctx->stage = ZSTDds_checkChecksum;
                } else {
                    dctx->expected = 0; /* end of frame */
                    dctx->stage = ZSTDds_getFrameHeaderSize;
                }
            } else {
                dctx->expected = ZSTD_blockHeaderSize;  /* jump to next header */
                dctx->stage = ZSTDds_decodeBlockHeader;
            }
            return 0;
        }

    case ZSTDds_decompressLastBlock:
    case ZSTDds_decompressBlock:
        DEBUGLOG(5, "ZSTD_decompressContinue: case ZSTDds_decompressBlock");
        {   size_t rSize;
            switch(dctx->bType)
            {
            case bt_compressed:
                DEBUGLOG(5, "ZSTD_decompressContinue: case bt_compressed");
                rSize = ZSTD_decompressBlock_internal(dctx, dst, dstCapacity, src, srcSize, /* frame */ 1, is_streaming);
                dctx->expected = 0;  /* Streaming not supported */
                break;
            case bt_raw :
                assert(srcSize <= dctx->expected);
                rSize = ZSTD_copyRawBlock(dst, dstCapacity, src, srcSize);
                FORWARD_IF_ERROR(rSize, "ZSTD_copyRawBlock failed");
                assert(rSize == srcSize);
                dctx->expected -= rSize;
                break;
            case bt_rle :
                rSize = ZSTD_setRleBlock(dst, dstCapacity, *(const BYTE*)src, dctx->rleSize);
                dctx->expected = 0;  /* Streaming not supported */
                break;
            case bt_reserved :   /* should never happen */
            default:
                RETURN_ERROR(corruption_detected, "invalid block type");
            }
            FORWARD_IF_ERROR(rSize, "");
            RETURN_ERROR_IF(rSize > dctx->fParams.blockSizeMax, corruption_detected, "Decompressed Block Size Exceeds Maximum");
            DEBUGLOG(5, "ZSTD_decompressContinue: decoded size from block : %u", (unsigned)rSize);
            dctx->decodedSize += rSize;
            if (dctx->validateChecksum) XXH64_update(&dctx->xxhState, dst, rSize);
            dctx->previousDstEnd = (char*)dst + rSize;

            /* Stay on the same stage until we are finished streaming the block. */
            if (dctx->expected > 0) {
                return rSize;
            }

            if (dctx->stage == ZSTDds_decompressLastBlock) {   /* end of frame */
                DEBUGLOG(4, "ZSTD_decompressContinue: decoded size from frame : %u", (unsigned)dctx->decodedSize);
                RETURN_ERROR_IF(
                    dctx->fParams.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN
                 && dctx->decodedSize != dctx->fParams.frameContentSize,
                    corruption_detected, "");
                if (dctx->fParams.checksumFlag) {  /* another round for frame checksum */
                    dctx->expected = 4;
                    dctx->stage = ZSTDds_checkChecksum;
                } else {
                    ZSTD_DCtx_trace_end(dctx, dctx->decodedSize, dctx->processedCSize, /* streaming */ 1);
                    dctx->expected = 0;   /* ends here */
                    dctx->stage = ZSTDds_getFrameHeaderSize;
                }
            } else {
                dctx->stage = ZSTDds_decodeBlockHeader;
                dctx->expected = ZSTD_blockHeaderSize;
            }
            return rSize;
        }

    case ZSTDds_checkChecksum:
        assert(srcSize == 4);  /* guaranteed by dctx->expected */
        {
            if (dctx->validateChecksum) {
                U32 const h32 = (U32)XXH64_digest(&dctx->xxhState);
                U32 const check32 = MEM_readLE32(src);
                DEBUGLOG(4, "ZSTD_decompressContinue: checksum : calculated %08X :: %08X read", (unsigned)h32, (unsigned)check32);
                RETURN_ERROR_IF(check32 != h32, checksum_wrong, "");
            }
            ZSTD_DCtx_trace_end(dctx, dctx->decodedSize, dctx->processedCSize, /* streaming */ 1);
            dctx->expected = 0;
            dctx->stage = ZSTDds_getFrameHeaderSize;
            return 0;
        }

    case ZSTDds_decodeSkippableHeader:
        assert(src != NULL);
        assert(srcSize <= ZSTD_SKIPPABLEHEADERSIZE);
        ZSTD_memcpy(dctx->headerBuffer + (ZSTD_SKIPPABLEHEADERSIZE - srcSize), src, srcSize);   /* complete skippable header */
        dctx->expected = MEM_readLE32(dctx->headerBuffer + ZSTD_FRAMEIDSIZE);   /* note : dctx->expected can grow seriously large, beyond local buffer size */
        dctx->stage = ZSTDds_skipFrame;
        return 0;

    case ZSTDds_skipFrame:
        dctx->expected = 0;
        dctx->stage = ZSTDds_getFrameHeaderSize;
        return 0;

    default:
        assert(0);   /* impossible */
        RETURN_ERROR(GENERIC, "impossible to reach");   /* some compilers require default to do something */
    }
}